

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffppxn(fitsfile *fptr,int datatype,long *firstpix,LONGLONG nelem,void *array,void *nulval,
          int *status)

{
  int *status_00;
  fitsfile *in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 in_R8;
  long in_R9;
  int *in_stack_00000008;
  LONGLONG naxes [9];
  LONGLONG dimsize;
  LONGLONG firstelem;
  long group;
  int ii;
  int naxis;
  int *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  fitsfile *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff76;
  uchar in_stack_ffffffffffffff77;
  double *in_stack_ffffffffffffff78;
  long in_stack_ffffffffffffff80;
  fitsfile *in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  fitsfile *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  long local_58;
  int *in_stack_ffffffffffffffb0;
  long lVar1;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  int in_stack_ffffffffffffffc4;
  int local_4;
  
  local_58 = 1;
  if (*in_stack_00000008 < 1) {
    if (in_R9 == 0) {
      ffppx(in_RCX,(int)((ulong)in_R8 >> 0x20),(long *)0x0,
            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(void *)0x1,
            in_stack_ffffffffffffffb0);
      local_4 = *in_stack_00000008;
    }
    else {
      ffgidm(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      ffgiszll(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               (LONGLONG *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      lVar1 = 0;
      for (iVar2 = 0; iVar2 < in_stack_ffffffffffffffc4; iVar2 = iVar2 + 1) {
        lVar1 = (*(long *)(in_RDX + (long)iVar2 * 8) + -1) * local_58 + lVar1;
        local_58 = *(long *)(&stack0xffffffffffffff58 + (long)iVar2 * 8) * local_58;
      }
      status_00 = (int *)(lVar1 + 1);
      if (in_ESI == 0xb) {
        ffppnb(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (uchar *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,status_00);
      }
      else if (in_ESI == 0xc) {
        ffppnsb(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,status_00);
      }
      else if (in_ESI == 0x14) {
        ffppnui(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                (unsigned_short *)in_stack_ffffffffffffff78,
                CONCAT11(in_stack_ffffffffffffff77,in_stack_ffffffffffffff76),status_00);
      }
      else if (in_ESI == 0x15) {
        ffppni(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (short *)in_stack_ffffffffffffff78,
               CONCAT11(in_stack_ffffffffffffff77,in_stack_ffffffffffffff76),status_00);
      }
      else if (in_ESI == 0x1e) {
        ffppnuk(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                (uint *)in_stack_ffffffffffffff78,
                CONCAT13(in_stack_ffffffffffffff77,
                         CONCAT12(in_stack_ffffffffffffff76,in_stack_ffffffffffffff74)),status_00);
      }
      else if (in_ESI == 0x1f) {
        ffppnk(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (int *)in_stack_ffffffffffffff78,
               CONCAT13(in_stack_ffffffffffffff77,
                        CONCAT12(in_stack_ffffffffffffff76,in_stack_ffffffffffffff74)),status_00);
      }
      else if (in_ESI == 0x28) {
        ffppnuj(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                (unsigned_long *)in_stack_ffffffffffffff78,
                CONCAT17(in_stack_ffffffffffffff77,
                         CONCAT16(in_stack_ffffffffffffff76,
                                  CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))),
                status_00);
      }
      else if (in_ESI == 0x29) {
        ffppnj(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (long *)in_stack_ffffffffffffff78,
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,
                                 CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))),
               status_00);
      }
      else if (in_ESI == 0x50) {
        ffppnujj(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 (LONGLONG)in_stack_ffffffffffffff78,
                 CONCAT17(in_stack_ffffffffffffff77,
                          CONCAT16(in_stack_ffffffffffffff76,
                                   CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))),
                 (ULONGLONG *)in_stack_ffffffffffffff68,
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffffa0);
      }
      else if (in_ESI == 0x51) {
        ffppnjj(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                (LONGLONG)in_stack_ffffffffffffff78,
                CONCAT17(in_stack_ffffffffffffff77,
                         CONCAT16(in_stack_ffffffffffffff76,
                                  CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))),
                (LONGLONG *)in_stack_ffffffffffffff68,
                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                in_stack_ffffffffffffffa0);
      }
      else if (in_ESI == 0x2a) {
        ffppne(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (float *)in_stack_ffffffffffffff78,
               (float)CONCAT13(in_stack_ffffffffffffff77,
                               CONCAT12(in_stack_ffffffffffffff76,in_stack_ffffffffffffff74)),
               &in_stack_ffffffffffffff68->HDUposition);
      }
      else if (in_ESI == 0x52) {
        ffppnd(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (LONGLONG)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,
               (double)CONCAT17(in_stack_ffffffffffffff77,
                                CONCAT16(in_stack_ffffffffffffff76,
                                         CONCAT24(in_stack_ffffffffffffff74,
                                                  in_stack_ffffffffffffff70))),
               &in_stack_ffffffffffffff68->HDUposition);
      }
      else {
        *in_stack_00000008 = 0x19a;
      }
      local_4 = *in_stack_00000008;
    }
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int ffppxn(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            long  *firstpix, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            void  *nulval,   /* I - pointer to the null value               */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).

  This routine supports writing to large images with
  more than 2**31 pixels.
*/
{
    int naxis, ii;
    long group = 1;
    LONGLONG firstelem, dimsize = 1, naxes[9];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (nulval == NULL)  /* null value not defined? */
    {
        ffppx(fptr, datatype, firstpix, nelem, array, status);
        return(*status);
    }

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgiszll(fptr, 9, naxes, status);

    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
    }
    firstelem++;

    if (datatype == TBYTE)
    {
      ffppnb(fptr, group, firstelem, nelem, (unsigned char *) array, 
             *(unsigned char *) nulval, status);
    }
    else if (datatype == TSBYTE)
    {
      ffppnsb(fptr, group, firstelem, nelem, (signed char *) array, 
             *(signed char *) nulval, status);
    }
    else if (datatype == TUSHORT)
    {
      ffppnui(fptr, group, firstelem, nelem, (unsigned short *) array,
              *(unsigned short *) nulval,status);
    }
    else if (datatype == TSHORT)
    {
      ffppni(fptr, group, firstelem, nelem, (short *) array,
             *(short *) nulval, status);
    }
    else if (datatype == TUINT)
    {
      ffppnuk(fptr, group, firstelem, nelem, (unsigned int *) array,
             *(unsigned int *) nulval, status);
    }
    else if (datatype == TINT)
    {
      ffppnk(fptr, group, firstelem, nelem, (int *) array,
             *(int *) nulval, status);
    }
    else if (datatype == TULONG)
    {
      ffppnuj(fptr, group, firstelem, nelem, (unsigned long *) array,
              *(unsigned long *) nulval,status);
    }
    else if (datatype == TLONG)
    {
      ffppnj(fptr, group, firstelem, nelem, (long *) array,
             *(long *) nulval, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffppnujj(fptr, group, firstelem, nelem, (ULONGLONG *) array,
             *(ULONGLONG *) nulval, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffppnjj(fptr, group, firstelem, nelem, (LONGLONG *) array,
             *(LONGLONG *) nulval, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppne(fptr, group, firstelem, nelem, (float *) array,
             *(float *) nulval, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffppnd(fptr, group, firstelem, nelem, (double *) array,
             *(double *) nulval, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}